

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  rle16_t *prVar3;
  ushort *puVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  rle16_t *prVar7;
  bool bVar8;
  uint uVar9;
  _Bool _Var10;
  uint uVar11;
  int iVar12;
  undefined8 in_RAX;
  run_container_t *prVar13;
  array_container_t *paVar14;
  bitset_container_t *src_1_00;
  run_container_t *prVar15;
  ushort uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  int32_t iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint8_t return_type;
  byte local_31;
  
  local_31 = (byte)((ulong)in_RAX >> 0x38);
  uVar11 = croaring_hardware_support();
  if ((uVar11 & 2) == 0) {
    uVar11 = croaring_hardware_support();
    if ((uVar11 & 1) == 0) {
      iVar12 = src_1->n_runs;
      lVar17 = (long)iVar12;
      if (0 < lVar17) {
        lVar19 = 0;
        do {
          iVar12 = iVar12 + (uint)src_1->runs[lVar19].length;
          lVar19 = lVar19 + 1;
        } while (lVar17 != lVar19);
      }
    }
    else {
      iVar12 = _avx2_run_container_cardinality(src_1);
    }
  }
  else {
    iVar12 = _avx512_run_container_cardinality(src_1);
  }
  if (iVar12 < 0x21) {
    if (src_2->cardinality == 0) {
      prVar13 = run_container_clone(src_1);
      *dst = prVar13;
      uVar11 = 3;
    }
    else {
      prVar13 = run_container_create_given_capacity(src_2->cardinality + iVar12);
      bVar8 = 0 < src_1->n_runs;
      if (0 < src_1->n_runs) {
        prVar3 = src_1->runs;
        uVar11 = (uint)prVar3->value;
        uVar18 = (uint)prVar3->length + (uint)prVar3->value + 1;
        iVar12 = src_2->cardinality;
        if (iVar12 < 1) {
          uVar24 = 0;
        }
        else {
          puVar4 = src_2->array;
          uVar21 = (uint)*puVar4;
          iVar20 = 0;
          uVar24 = 0;
          do {
            uVar16 = (ushort)uVar11;
            uVar9 = uVar11;
            if (uVar21 < uVar18) {
              if (uVar21 < uVar11) {
                iVar20 = iVar20 + 1;
                if (iVar20 < iVar12) {
                  uVar21 = (uint)puVar4[iVar20];
                }
              }
              else {
                if (uVar11 < uVar21) {
                  prVar7 = prVar13->runs;
                  iVar2 = prVar13->n_runs;
                  prVar13->n_runs = iVar2 + 1;
                  prVar7[iVar2].value = uVar16;
                  prVar7[iVar2].length = ~uVar16 + (short)uVar21;
                }
                uVar9 = uVar21 + 1;
                if (uVar18 <= uVar21 + 1) goto LAB_00114716;
              }
            }
            else {
              prVar7 = prVar13->runs;
              iVar2 = prVar13->n_runs;
              prVar13->n_runs = iVar2 + 1;
              prVar7[iVar2].value = uVar16;
              prVar7[iVar2].length = ~uVar16 + (short)uVar18;
LAB_00114716:
              uVar24 = uVar24 + 1;
              uVar9 = uVar11;
              if ((int)uVar24 < src_1->n_runs) {
                uVar18 = (uint)prVar3[(int)uVar24].length + (uint)prVar3[(int)uVar24].value + 1;
                uVar9 = (uint)prVar3[(int)uVar24].value;
              }
            }
            uVar11 = uVar9;
            bVar8 = (int)uVar24 < src_1->n_runs;
            if (src_1->n_runs <= (int)uVar24) goto LAB_001149d5;
          } while (iVar20 < iVar12);
        }
        if (bVar8) {
          prVar7 = prVar13->runs;
          lVar17 = (long)prVar13->n_runs;
          prVar13->n_runs = (int32_t)(lVar17 + 1);
          prVar7[lVar17].value = (ushort)uVar11;
          prVar7[lVar17].length = (short)uVar18 + ~(ushort)uVar11;
          iVar12 = uVar24 + 1;
          iVar20 = src_1->n_runs - iVar12;
          if (iVar20 != 0 && iVar12 <= src_1->n_runs) {
            memcpy(prVar7 + lVar17 + 1,prVar3 + iVar12,(long)iVar20 << 2);
            prVar13->n_runs = prVar13->n_runs + ~uVar24 + src_1->n_runs;
          }
        }
      }
LAB_001149d5:
      prVar15 = (run_container_t *)convert_run_to_efficient_container(prVar13,&local_31);
      *dst = prVar15;
      if (prVar13 != (run_container_t *)0x0 && prVar13 != prVar15) {
        (*global_memory_hook.free)(prVar13->runs);
        (*global_memory_hook.free)(prVar13);
      }
      uVar11 = (uint)local_31;
    }
  }
  else if (iVar12 < 0x1001) {
    paVar14 = array_container_create_given_capacity(iVar12);
    iVar12 = src_1->n_runs;
    if ((long)iVar12 < 1) {
      iVar22 = 0;
    }
    else {
      prVar3 = src_1->runs;
      puVar5 = src_2->array;
      iVar2 = src_2->cardinality;
      iVar20 = -1;
      lVar17 = 0;
      iVar22 = 0;
      do {
        uVar16 = prVar3[lVar17].value;
        uVar11 = (uint)uVar16;
        iVar25 = iVar20 + 1;
        iVar27 = iVar25;
        if ((iVar25 < iVar2) && (puVar5[iVar25] < uVar16)) {
          iVar20 = iVar20 + 2;
          iVar26 = 0;
          iVar23 = iVar2 + -1;
          if (iVar20 < iVar2) {
            iVar27 = 1;
            do {
              iVar23 = iVar20;
              iVar26 = iVar27;
              if (uVar16 <= puVar5[iVar20]) break;
              iVar26 = iVar27 * 2;
              iVar20 = iVar25 + iVar27 * 2;
              iVar23 = iVar2 + -1;
              iVar27 = iVar26;
            } while (iVar20 < iVar2);
            iVar26 = iVar26 >> 1;
          }
          iVar27 = iVar23;
          if (((puVar5[iVar23] != uVar16) && (iVar27 = iVar2, uVar16 <= puVar5[iVar23])) &&
             (iVar27 = iVar23, iVar26 + iVar25 + 1 != iVar23)) {
            iVar26 = iVar26 + iVar25;
            do {
              iVar27 = iVar26 + iVar23 >> 1;
              if (puVar5[iVar27] == uVar16) break;
              iVar20 = iVar27;
              if (puVar5[iVar27] < uVar16) {
                iVar20 = iVar23;
                iVar26 = iVar27;
              }
              iVar27 = iVar20;
              iVar23 = iVar20;
            } while (iVar26 + 1 != iVar20);
          }
        }
        iVar20 = iVar27;
        uVar1 = prVar3[lVar17].length;
        if (iVar20 < iVar2) {
          uVar18 = (uint)puVar5[iVar20];
          if ((uint)uVar1 + (uint)uVar16 < (uint)puVar5[iVar20]) {
            puVar6 = paVar14->array;
            lVar19 = 0;
            do {
              puVar6[iVar22 + lVar19] = uVar16 + (short)lVar19;
              lVar19 = lVar19 + 1;
            } while (uVar1 + 1 != (int)lVar19);
            iVar22 = iVar22 + (int)lVar19;
          }
          else {
            iVar27 = uVar1 + 1;
            do {
              if (uVar11 == uVar18) {
                iVar25 = iVar20 + 1;
                if (iVar25 < iVar2) {
                  uVar18 = (uint)puVar5[iVar25];
                  iVar20 = iVar25;
                }
                else {
                  uVar18 = 0;
                }
              }
              else {
                lVar19 = (long)iVar22;
                iVar22 = iVar22 + 1;
                paVar14->array[lVar19] = (uint16_t)uVar11;
              }
              uVar11 = uVar11 + 1;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          iVar20 = iVar20 + -1;
        }
        else {
          puVar6 = paVar14->array;
          lVar19 = 0;
          do {
            puVar6[iVar22 + lVar19] = uVar16 + (short)lVar19;
            lVar19 = lVar19 + 1;
          } while (uVar1 + 1 != (int)lVar19);
          iVar22 = iVar22 + (int)lVar19;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar12);
    }
    paVar14->cardinality = iVar22;
    *dst = paVar14;
    uVar11 = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(src_1);
    _Var10 = bitset_array_container_iandnot(src_1_00,src_2,dst);
    uVar11 = 2 - _Var10;
  }
  return uVar11;
}

Assistant:

int run_array_container_andnot(const run_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    CROARING_MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        CROARING_MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] =
                CROARING_MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
}